

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

ChGenotype * __thiscall
chrono::ChOptimizerGenetic::Select_roulette(ChOptimizerGenetic *this,ChGenotype **my_population)

{
  ChGenotype **ppCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ChGenotype *pCVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  int i;
  long lVar10;
  ChGenotype *mselected;
  ChGenotype *pCVar11;
  ChGenotype *pCVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double mbestfitness;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double local_30;
  double local_28;
  
  pCVar5 = *my_population;
  iVar4 = *(int *)&(this->super_ChOptimizer).field_0x144;
  lVar9 = (long)iVar4;
  dVar16 = pCVar5->fitness;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar16;
  if (lVar9 < 1) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = this->eugenetics;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar16 - dVar16;
    auVar19 = vfmadd132sd_fma(auVar18,auVar19,auVar6);
    local_30 = auVar19._0_8_;
  }
  else {
    auVar17._8_8_ = 0x7fffffffffffffff;
    auVar17._0_8_ = 0x7fffffffffffffff;
    lVar10 = 0;
    pCVar11 = pCVar5;
    auVar6 = auVar19;
    do {
      dVar16 = my_population[lVar10]->fitness;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar16;
      auVar18 = vandpd_avx(auVar25,auVar17);
      uVar7 = vcmppd_avx512vl(auVar18,ZEXT816(0x412e847e00000000),4);
      uVar8 = vcmppd_avx512vl(auVar25,auVar6,1);
      bVar13 = (bool)((byte)uVar7 & 3 & (byte)uVar8 & 1);
      if (bVar13 != false) {
        pCVar11 = my_population[lVar10];
      }
      lVar10 = lVar10 + 1;
      auVar14._0_8_ = (ulong)bVar13 * (long)dVar16 + (ulong)!bVar13 * auVar6._0_8_;
      auVar14._8_8_ = auVar6._8_8_;
      auVar6 = auVar14;
    } while (lVar9 != lVar10);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = pCVar11->fitness;
    lVar10 = 0;
    pCVar12 = pCVar5;
    do {
      dVar16 = my_population[lVar10]->fitness;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar16;
      auVar6 = vandpd_avx(auVar26,auVar17);
      uVar7 = vcmppd_avx512vl(auVar6,ZEXT816(0x412e847e00000000),4);
      uVar8 = vcmppd_avx512vl(auVar19,auVar26,1);
      bVar13 = (bool)((byte)uVar7 & 3 & (byte)uVar8 & 1);
      if (bVar13 != false) {
        pCVar12 = my_population[lVar10];
      }
      lVar10 = lVar10 + 1;
      auVar15._0_8_ = (ulong)bVar13 * (long)dVar16 + (ulong)!bVar13 * auVar19._0_8_;
      auVar15._8_8_ = auVar19._8_8_;
      auVar19 = auVar15;
    } while (lVar9 != lVar10);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->eugenetics;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = pCVar12->fitness - pCVar11->fitness;
    auVar19 = vfmadd132sd_fma(auVar27,auVar21,auVar3);
    local_30 = auVar19._0_8_;
    if (0 < iVar4) {
      local_28 = 0.0;
      lVar10 = 0;
      do {
        ppCVar1 = my_population + lVar10;
        lVar10 = lVar10 + 1;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = (*ppCVar1)->fitness;
        auVar19 = vandpd_avx(auVar22,auVar17);
        uVar7 = vcmpsd_avx512f(auVar19,ZEXT816(0x412e847e00000000),4);
        bVar13 = (bool)((byte)uVar7 & 1);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = (*ppCVar1)->fitness - local_30;
        auVar19 = vmaxsd_avx(ZEXT816(0),auVar23);
        local_28 = (double)((ulong)bVar13 * (long)(local_28 + auVar19._0_8_) +
                           (ulong)!bVar13 * (long)local_28);
      } while (lVar9 != lVar10);
      goto LAB_007cdd52;
    }
  }
  local_28 = 0.0;
LAB_007cdd52:
  dVar16 = ChRandom();
  lVar9 = (long)*(int *)&(this->super_ChOptimizer).field_0x144;
  if (0 < lVar9) {
    auVar20._8_8_ = 0x7fffffffffffffff;
    auVar20._0_8_ = 0x7fffffffffffffff;
    dVar24 = 0.0;
    lVar10 = 0;
    do {
      dVar2 = my_population[lVar10]->fitness;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar2;
      auVar19 = vandpd_avx(auVar28,auVar20);
      if ((auVar19._0_8_ != 999999.0) || (NAN(auVar19._0_8_))) {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar2 - local_30;
        auVar19 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar29);
        dVar24 = dVar24 + auVar19._0_8_;
        if (dVar16 * local_28 <= dVar24) {
          return my_population[lVar10];
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  return pCVar5;
}

Assistant:

ChGenotype* ChOptimizerGenetic::Select_roulette(ChGenotype** my_population) {
    ChGenotype* mselected = my_population[0];

    // compute sum of all fitness, relative to worst.
    double msum = 0;
    double norm_fitness;
    double minf_fit = Select_worst(my_population)->fitness;
    double msup_fit = Select_best(my_population)->fitness;
    double clamp_fit = minf_fit + eugenetics * (msup_fit - minf_fit);

    int i;
    for (i = 0; i < popsize; i++) {
        if (fabs(my_population[i]->fitness) != OPT_IMPOSSIBLE) {
            norm_fitness = my_population[i]->fitness - clamp_fit;
            if (norm_fitness < 0)
                norm_fitness = 0;
            msum = msum + norm_fitness;
        }
    }

    double number = ChRandom() * msum;  // the sorted-out number!
    double partialsum = 0;
    for (i = 0; i < popsize; i++) {
        if (fabs(my_population[i]->fitness) != OPT_IMPOSSIBLE) {
            norm_fitness = my_population[i]->fitness - clamp_fit;
            if (norm_fitness < 0)
                norm_fitness = 0;
            partialsum = partialsum + norm_fitness;
            if (partialsum >= number)
                return my_population[i];  // the number was ok.
        }
    }
    // default .
    return mselected;
}